

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

void __thiscall BigInt::operator-=(BigInt *this,BigInt *that)

{
  BigInt local_38;
  BigInt *local_18;
  BigInt *that_local;
  BigInt *this_local;
  
  local_18 = that;
  that_local = this;
  operator-(&local_38,this,that);
  operator=(this,&local_38);
  ~BigInt(&local_38);
  return;
}

Assistant:

void operator-=(const BigInt &that) {
        *this = *this - that;
    }